

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O3

int __thiscall webrtc::Resampler::Reset(Resampler *this,int inFreq,int outFreq,size_t num_channels)

{
  int iVar1;
  uint uVar2;
  Resampler *pRVar3;
  WebRtcSpl_State16khzTo48khz *pWVar4;
  WebRtcSpl_State8khzTo22khz *state;
  void *pvVar5;
  WebRtcSpl_State16khzTo22khz *state_00;
  WebRtcSpl_State48khzTo16khz *pWVar6;
  WebRtcSpl_State22khzTo8khz *pWVar7;
  WebRtcSpl_State22khzTo16khz *pWVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  
  iVar12 = -1;
  if (num_channels - 3 < 0xfffffffffffffffe) {
    return -1;
  }
  this->num_channels_ = num_channels;
  if (this->state1_ != (void *)0x0) {
    free(this->state1_);
    this->state1_ = (void *)0x0;
  }
  if (this->state2_ != (void *)0x0) {
    free(this->state2_);
    this->state2_ = (void *)0x0;
  }
  if (this->state3_ != (void *)0x0) {
    free(this->state3_);
    this->state3_ = (void *)0x0;
  }
  if (this->in_buffer_ != (int16_t *)0x0) {
    free(this->in_buffer_);
    this->in_buffer_ = (int16_t *)0x0;
  }
  if (this->out_buffer_ != (int16_t *)0x0) {
    free(this->out_buffer_);
    this->out_buffer_ = (int16_t *)0x0;
  }
  pRVar3 = this->slave_left_;
  if (pRVar3 != (Resampler *)0x0) {
    ~Resampler(pRVar3);
    operator_delete(pRVar3);
    this->slave_left_ = (Resampler *)0x0;
  }
  pRVar3 = this->slave_right_;
  if (pRVar3 != (Resampler *)0x0) {
    ~Resampler(pRVar3);
    operator_delete(pRVar3);
    this->slave_right_ = (Resampler *)0x0;
  }
  uVar11 = (long)inFreq % (long)outFreq & 0xffffffff;
  this->in_buffer_size_max_ = 0;
  this->out_buffer_size_max_ = 0;
  this->in_buffer_size_ = 0;
  this->out_buffer_size_ = 0;
  uVar10 = (uint)((long)inFreq % (long)outFreq);
  iVar1 = outFreq;
  while (uVar10 != 0) {
    iVar9 = (int)uVar11;
    uVar10 = iVar1 % iVar9;
    uVar11 = (ulong)uVar10;
    iVar1 = iVar9;
  }
  this->my_in_frequency_khz_ = inFreq / 1000;
  this->my_out_frequency_khz_ = outFreq / 1000;
  uVar13 = inFreq / iVar1;
  uVar10 = outFreq / iVar1;
  if (this->num_channels_ == 2) {
    pRVar3 = (Resampler *)operator_new(0x70);
    Resampler(pRVar3,uVar13,uVar10,1);
    this->slave_left_ = pRVar3;
    pRVar3 = (Resampler *)operator_new(0x70);
    Resampler(pRVar3,uVar13,uVar10,1);
    this->slave_right_ = pRVar3;
  }
  if (uVar13 == uVar10) {
    this->my_mode_ = kResamplerMode1To1;
  }
  else if (uVar13 == 1) {
    switch(uVar10) {
    case 2:
      this->my_mode_ = kResamplerMode1To2;
LAB_00144de9:
      pvVar5 = calloc(1,0x20);
      this->state1_ = pvVar5;
      goto LAB_00144f91;
    case 3:
      this->my_mode_ = kResamplerMode1To3;
      pWVar4 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state1_ = pWVar4;
      break;
    case 4:
      this->my_mode_ = kResamplerMode1To4;
LAB_00144f30:
      pvVar5 = calloc(1,0x20);
      this->state1_ = pvVar5;
      goto LAB_00144f7e;
    default:
      goto switchD_00144db3_caseD_5;
    case 6:
      this->my_mode_ = kResamplerMode1To6;
      pvVar5 = calloc(1,0x20);
      this->state1_ = pvVar5;
      pWVar4 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state2_ = pWVar4;
      break;
    case 0xc:
      this->my_mode_ = kResamplerMode1To12;
      pvVar5 = calloc(1,0x20);
      this->state1_ = pvVar5;
      pvVar5 = calloc(1,0x20);
      this->state2_ = pvVar5;
      pWVar4 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state3_ = pWVar4;
    }
    WebRtcSpl_ResetResample16khzTo48khz(pWVar4);
  }
  else if (uVar10 == 1) {
    switch(uVar13) {
    case 2:
      this->my_mode_ = kResamplerMode2To1;
      goto LAB_00144de9;
    case 3:
      this->my_mode_ = kResamplerMode3To1;
      pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
      this->state1_ = pWVar6;
LAB_00144f58:
      WebRtcSpl_ResetResample48khzTo16khz(pWVar6);
      break;
    case 4:
      this->my_mode_ = kResamplerMode4To1;
      goto LAB_00144f30;
    default:
      goto switchD_00144db3_caseD_5;
    case 6:
      this->my_mode_ = kResamplerMode6To1;
      pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
      this->state1_ = pWVar6;
      WebRtcSpl_ResetResample48khzTo16khz(pWVar6);
LAB_00144f7e:
      pvVar5 = calloc(1,0x20);
      this->state2_ = pvVar5;
      break;
    case 0xc:
      this->my_mode_ = kResamplerMode12To1;
      pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
      this->state1_ = pWVar6;
      WebRtcSpl_ResetResample48khzTo16khz(pWVar6);
      pvVar5 = calloc(1,0x20);
      this->state2_ = pvVar5;
LAB_00144fcd:
      pvVar5 = calloc(1,0x20);
      this->state3_ = pvVar5;
    }
  }
  else {
    if (uVar10 == 3 && (uVar13 ^ 2) == 0) {
      this->my_mode_ = kResamplerMode2To3;
      pWVar4 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
      this->state1_ = pWVar4;
      WebRtcSpl_ResetResample16khzTo48khz(pWVar4);
      goto LAB_00144f7e;
    }
    uVar2 = uVar10 ^ 0xb;
    if ((uVar13 ^ 2) == 0 && uVar2 == 0) {
      this->my_mode_ = kResamplerMode2To11;
      pvVar5 = calloc(1,0x20);
      this->state1_ = pvVar5;
      state = (WebRtcSpl_State8khzTo22khz *)malloc(0x60);
      this->state2_ = state;
    }
    else {
      if (uVar13 != 4 || uVar2 != 0) {
        if (uVar13 == 8 && uVar2 == 0) {
          this->my_mode_ = kResamplerMode8To11;
          state_00 = (WebRtcSpl_State16khzTo22khz *)malloc(0x40);
          this->state1_ = state_00;
          WebRtcSpl_ResetResample16khzTo22khz(state_00);
        }
        else {
          if (uVar13 == 3 && (uVar10 ^ 2) == 0) {
            this->my_mode_ = kResamplerMode3To2;
            pvVar5 = calloc(1,0x20);
            this->state1_ = pvVar5;
            pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
            this->state2_ = pWVar6;
            goto LAB_00144f58;
          }
          uVar13 = uVar13 ^ 0xb;
          if ((uVar10 ^ 2) == 0 && uVar13 == 0) {
            this->my_mode_ = kResamplerMode11To2;
            pWVar7 = (WebRtcSpl_State22khzTo8khz *)malloc(0x80);
            this->state1_ = pWVar7;
            WebRtcSpl_ResetResample22khzTo8khz(pWVar7);
            goto LAB_00144f7e;
          }
          if (uVar10 == 4 && uVar13 == 0) {
            this->my_mode_ = kResamplerMode11To4;
            pWVar7 = (WebRtcSpl_State22khzTo8khz *)malloc(0x80);
            this->state1_ = pWVar7;
            WebRtcSpl_ResetResample22khzTo8khz(pWVar7);
          }
          else {
            if (uVar10 == 0x10 && uVar13 == 0) {
              this->my_mode_ = kResamplerMode11To16;
              pvVar5 = calloc(1,0x20);
              this->state1_ = pvVar5;
              pWVar8 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
              this->state2_ = pWVar8;
            }
            else {
              if (uVar10 == 0x20 && uVar13 == 0) {
                this->my_mode_ = kResamplerMode11To32;
                pvVar5 = calloc(1,0x20);
                this->state1_ = pvVar5;
                pWVar8 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
                this->state2_ = pWVar8;
                WebRtcSpl_ResetResample22khzTo16khz(pWVar8);
                goto LAB_00144fcd;
              }
              if (uVar13 != 0 || uVar10 != 8) {
                return -1;
              }
              this->my_mode_ = kResamplerMode11To8;
              pWVar8 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
              this->state1_ = pWVar8;
            }
            WebRtcSpl_ResetResample22khzTo16khz(pWVar8);
          }
        }
        goto LAB_00144f91;
      }
      this->my_mode_ = kResamplerMode4To11;
      state = (WebRtcSpl_State8khzTo22khz *)malloc(0x60);
      this->state1_ = state;
    }
    WebRtcSpl_ResetResample8khzTo22khz(state);
  }
LAB_00144f91:
  iVar12 = 0;
switchD_00144db3_caseD_5:
  return iVar12;
}

Assistant:

int Resampler::Reset(int inFreq, int outFreq, size_t num_channels)
{
    if (num_channels != 1 && num_channels != 2) {
      return -1;
    }
    num_channels_ = num_channels;

    if (state1_)
    {
        free(state1_);
        state1_ = NULL;
    }
    if (state2_)
    {
        free(state2_);
        state2_ = NULL;
    }
    if (state3_)
    {
        free(state3_);
        state3_ = NULL;
    }
    if (in_buffer_)
    {
        free(in_buffer_);
        in_buffer_ = NULL;
    }
    if (out_buffer_)
    {
        free(out_buffer_);
        out_buffer_ = NULL;
    }
    if (slave_left_)
    {
        delete slave_left_;
        slave_left_ = NULL;
    }
    if (slave_right_)
    {
        delete slave_right_;
        slave_right_ = NULL;
    }

    in_buffer_size_ = 0;
    out_buffer_size_ = 0;
    in_buffer_size_max_ = 0;
    out_buffer_size_max_ = 0;

    // Start with a math exercise, Euclid's algorithm to find the gcd:
    int a = inFreq;
    int b = outFreq;
    int c = a % b;
    while (c != 0)
    {
        a = b;
        b = c;
        c = a % b;
    }
    // b is now the gcd;

    // We need to track what domain we're in.
    my_in_frequency_khz_ = inFreq / 1000;
    my_out_frequency_khz_ = outFreq / 1000;

    // Scale with GCD
    inFreq = inFreq / b;
    outFreq = outFreq / b;

    if (num_channels_ == 2)
    {
        // Create two mono resamplers.
        slave_left_ = new Resampler(inFreq, outFreq, 1);
        slave_right_ = new Resampler(inFreq, outFreq, 1);
    }

    if (inFreq == outFreq)
    {
        my_mode_ = kResamplerMode1To1;
    } else if (inFreq == 1)
    {
        switch (outFreq)
        {
            case 2:
                my_mode_ = kResamplerMode1To2;
                break;
            case 3:
                my_mode_ = kResamplerMode1To3;
                break;
            case 4:
                my_mode_ = kResamplerMode1To4;
                break;
            case 6:
                my_mode_ = kResamplerMode1To6;
                break;
            case 12:
                my_mode_ = kResamplerMode1To12;
                break;
            default:
                return -1;
        }
    } else if (outFreq == 1)
    {
        switch (inFreq)
        {
            case 2:
                my_mode_ = kResamplerMode2To1;
                break;
            case 3:
                my_mode_ = kResamplerMode3To1;
                break;
            case 4:
                my_mode_ = kResamplerMode4To1;
                break;
            case 6:
                my_mode_ = kResamplerMode6To1;
                break;
            case 12:
                my_mode_ = kResamplerMode12To1;
                break;
            default:
                return -1;
        }
    } else if ((inFreq == 2) && (outFreq == 3))
    {
        my_mode_ = kResamplerMode2To3;
    } else if ((inFreq == 2) && (outFreq == 11))
    {
        my_mode_ = kResamplerMode2To11;
    } else if ((inFreq == 4) && (outFreq == 11))
    {
        my_mode_ = kResamplerMode4To11;
    } else if ((inFreq == 8) && (outFreq == 11))
    {
        my_mode_ = kResamplerMode8To11;
    } else if ((inFreq == 3) && (outFreq == 2))
    {
        my_mode_ = kResamplerMode3To2;
    } else if ((inFreq == 11) && (outFreq == 2))
    {
        my_mode_ = kResamplerMode11To2;
    } else if ((inFreq == 11) && (outFreq == 4))
    {
        my_mode_ = kResamplerMode11To4;
    } else if ((inFreq == 11) && (outFreq == 16))
    {
        my_mode_ = kResamplerMode11To16;
    } else if ((inFreq == 11) && (outFreq == 32))
    {
        my_mode_ = kResamplerMode11To32;
    } else if ((inFreq == 11) && (outFreq == 8))
    {
        my_mode_ = kResamplerMode11To8;
    } else
    {
        return -1;
    }

    // Now create the states we need
    switch (my_mode_)
    {
        case kResamplerMode1To1:
            // No state needed;
            break;
        case kResamplerMode1To2:
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));
            break;
        case kResamplerMode1To3:
            state1_ = malloc(sizeof(WebRtcSpl_State16khzTo48khz));
            WebRtcSpl_ResetResample16khzTo48khz((WebRtcSpl_State16khzTo48khz *)state1_);
            break;
        case kResamplerMode1To4:
            // 1:2
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));
            // 2:4
            state2_ = malloc(8 * sizeof(int32_t));
            memset(state2_, 0, 8 * sizeof(int32_t));
            break;
        case kResamplerMode1To6:
            // 1:2
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));
            // 2:6
            state2_ = malloc(sizeof(WebRtcSpl_State16khzTo48khz));
            WebRtcSpl_ResetResample16khzTo48khz((WebRtcSpl_State16khzTo48khz *)state2_);
            break;
        case kResamplerMode1To12:
            // 1:2
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));
            // 2:4
            state2_ = malloc(8 * sizeof(int32_t));
            memset(state2_, 0, 8 * sizeof(int32_t));
            // 4:12
            state3_ = malloc(sizeof(WebRtcSpl_State16khzTo48khz));
            WebRtcSpl_ResetResample16khzTo48khz(
                (WebRtcSpl_State16khzTo48khz*) state3_);
            break;
        case kResamplerMode2To3:
            // 2:6
            state1_ = malloc(sizeof(WebRtcSpl_State16khzTo48khz));
            WebRtcSpl_ResetResample16khzTo48khz((WebRtcSpl_State16khzTo48khz *)state1_);
            // 6:3
            state2_ = malloc(8 * sizeof(int32_t));
            memset(state2_, 0, 8 * sizeof(int32_t));
            break;
        case kResamplerMode2To11:
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));

            state2_ = malloc(sizeof(WebRtcSpl_State8khzTo22khz));
            WebRtcSpl_ResetResample8khzTo22khz((WebRtcSpl_State8khzTo22khz *)state2_);
            break;
        case kResamplerMode4To11:
            state1_ = malloc(sizeof(WebRtcSpl_State8khzTo22khz));
            WebRtcSpl_ResetResample8khzTo22khz((WebRtcSpl_State8khzTo22khz *)state1_);
            break;
        case kResamplerMode8To11:
            state1_ = malloc(sizeof(WebRtcSpl_State16khzTo22khz));
            WebRtcSpl_ResetResample16khzTo22khz((WebRtcSpl_State16khzTo22khz *)state1_);
            break;
        case kResamplerMode11To16:
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));

            state2_ = malloc(sizeof(WebRtcSpl_State22khzTo16khz));
            WebRtcSpl_ResetResample22khzTo16khz((WebRtcSpl_State22khzTo16khz *)state2_);
            break;
        case kResamplerMode11To32:
            // 11 -> 22
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));

            // 22 -> 16
            state2_ = malloc(sizeof(WebRtcSpl_State22khzTo16khz));
            WebRtcSpl_ResetResample22khzTo16khz((WebRtcSpl_State22khzTo16khz *)state2_);

            // 16 -> 32
            state3_ = malloc(8 * sizeof(int32_t));
            memset(state3_, 0, 8 * sizeof(int32_t));

            break;
        case kResamplerMode2To1:
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));
            break;
        case kResamplerMode3To1:
            state1_ = malloc(sizeof(WebRtcSpl_State48khzTo16khz));
            WebRtcSpl_ResetResample48khzTo16khz((WebRtcSpl_State48khzTo16khz *)state1_);
            break;
        case kResamplerMode4To1:
            // 4:2
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));
            // 2:1
            state2_ = malloc(8 * sizeof(int32_t));
            memset(state2_, 0, 8 * sizeof(int32_t));
            break;
        case kResamplerMode6To1:
            // 6:2
            state1_ = malloc(sizeof(WebRtcSpl_State48khzTo16khz));
            WebRtcSpl_ResetResample48khzTo16khz((WebRtcSpl_State48khzTo16khz *)state1_);
            // 2:1
            state2_ = malloc(8 * sizeof(int32_t));
            memset(state2_, 0, 8 * sizeof(int32_t));
            break;
        case kResamplerMode12To1:
            // 12:4
            state1_ = malloc(sizeof(WebRtcSpl_State48khzTo16khz));
            WebRtcSpl_ResetResample48khzTo16khz(
                (WebRtcSpl_State48khzTo16khz*) state1_);
            // 4:2
            state2_ = malloc(8 * sizeof(int32_t));
            memset(state2_, 0, 8 * sizeof(int32_t));
            // 2:1
            state3_ = malloc(8 * sizeof(int32_t));
            memset(state3_, 0, 8 * sizeof(int32_t));
            break;
        case kResamplerMode3To2:
            // 3:6
            state1_ = malloc(8 * sizeof(int32_t));
            memset(state1_, 0, 8 * sizeof(int32_t));
            // 6:2
            state2_ = malloc(sizeof(WebRtcSpl_State48khzTo16khz));
            WebRtcSpl_ResetResample48khzTo16khz((WebRtcSpl_State48khzTo16khz *)state2_);
            break;
        case kResamplerMode11To2:
            state1_ = malloc(sizeof(WebRtcSpl_State22khzTo8khz));
            WebRtcSpl_ResetResample22khzTo8khz((WebRtcSpl_State22khzTo8khz *)state1_);

            state2_ = malloc(8 * sizeof(int32_t));
            memset(state2_, 0, 8 * sizeof(int32_t));

            break;
        case kResamplerMode11To4:
            state1_ = malloc(sizeof(WebRtcSpl_State22khzTo8khz));
            WebRtcSpl_ResetResample22khzTo8khz((WebRtcSpl_State22khzTo8khz *)state1_);
            break;
        case kResamplerMode11To8:
            state1_ = malloc(sizeof(WebRtcSpl_State22khzTo16khz));
            WebRtcSpl_ResetResample22khzTo16khz((WebRtcSpl_State22khzTo16khz *)state1_);
            break;

    }

    return 0;
}